

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O2

int32_t uloc_toLanguageTag_63
                  (char *localeID,char *langtag,int32_t langtagCapacity,UBool strict,
                  UErrorCode *status)

{
  char *pcVar1;
  UErrorCode UVar2;
  AttributeListEntry *pAVar3;
  char cVar4;
  char cVar5;
  UBool UVar6;
  uint uVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint uVar10;
  size_t sVar11;
  char *pcVar12;
  UEnumeration *en;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  VariantListEntry *pVVar16;
  CharString *pCVar17;
  AttributeListEntry *pAVar18;
  ExtensionListEntry *pEVar19;
  void *pvVar20;
  long lVar21;
  char (*__s2) [3];
  VariantListEntry *pVVar22;
  ulong uVar23;
  int iVar24;
  ExtensionListEntry *pEVar25;
  char (*__s) [4];
  int iVar26;
  int iVar27;
  AttributeListEntry **ppAVar28;
  bool bVar29;
  UErrorCode tmpStatus;
  char *local_258;
  undefined8 local_250;
  UErrorCode tmpStatus_2;
  char *local_240;
  char *local_238;
  undefined8 local_230;
  int32_t resultCapacity;
  int32_t resultCapacity_1;
  undefined8 local_220;
  VariantListEntry *local_218;
  AttributeListEntry *firstAttr;
  ExtensionListEntry *firstExt;
  int local_1fc;
  VariantListEntry *local_1f8;
  UErrorCode tmpStatus_1;
  UVector local_1e8;
  int32_t local_1bc;
  int32_t len;
  undefined4 uStack_1b4;
  undefined1 auStack_1b0 [48];
  int32_t local_180;
  CharString canonical;
  char buf [100];
  
  icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&canonical.buffer);
  canonical.len = 0;
  *canonical.buffer.ptr = '\0';
  tmpStatus = U_ZERO_ERROR;
  sVar11 = strlen(localeID);
  resultCapacity = (int32_t)sVar11;
  if (0 < resultCapacity) {
    while (pcVar12 = icu_63::CharString::getAppendBuffer
                               (&canonical,(int32_t)sVar11,(int32_t)sVar11,&resultCapacity,
                                &tmpStatus), tmpStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar7 = uloc_canonicalize_63(localeID,pcVar12,resultCapacity,&tmpStatus);
      sVar11 = (size_t)uVar7;
      if (tmpStatus != U_BUFFER_OVERFLOW_ERROR) {
        if (U_ZERO_ERROR < tmpStatus) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          goto LAB_002a1183;
        }
        icu_63::CharString::append(&canonical,pcVar12,uVar7,&tmpStatus);
        if (tmpStatus == U_STRING_NOT_TERMINATED_WARNING) {
          tmpStatus = U_ZERO_ERROR;
          goto LAB_002a118b;
        }
        if (tmpStatus < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002a118b;
        break;
      }
      tmpStatus = U_ZERO_ERROR;
      resultCapacity = uVar7;
    }
    *status = tmpStatus;
LAB_002a1183:
    iVar24 = 0;
    goto LAB_002a2452;
  }
LAB_002a118b:
  local_238 = langtag;
  pcVar12 = locale_getKeywordsStart_63(canonical.buffer.ptr);
  iVar9 = 0;
  iVar24 = 0;
  if (pcVar12 == canonical.buffer.ptr) {
    en = uloc_openKeywords_63(canonical.buffer.ptr,&tmpStatus);
    iVar24 = 0;
    if (en != (UEnumeration *)0x0) {
      iVar8 = uenum_count_63(en,&tmpStatus);
      if (iVar8 == 1) {
        _len = (VariantListEntry *)((ulong)_len & 0xffffffff00000000);
        pcVar12 = uenum_next_63(en,&len,&tmpStatus);
        bVar29 = true;
        iVar24 = 0;
        if ((len == 1) && (*pcVar12 == 'x')) {
          buf[0] = 'x';
          buf[1] = '-';
          iVar8 = uloc_getKeywordValue_63(localeID,pcVar12,buf + 2,0x62,&tmpStatus);
          _len = (VariantListEntry *)CONCAT44(uStack_1b4,iVar8);
          if (tmpStatus < U_ILLEGAL_ARGUMENT_ERROR) {
            UVar6 = _isPrivateuseValueSubtags(buf + 2,iVar8);
            if (UVar6 == '\0') {
              if (strict == '\0') goto LAB_002a247f;
              goto LAB_002a12cc;
            }
            iVar24 = len + 2;
            iVar8 = uprv_min_63(iVar24,langtagCapacity);
            pcVar12 = local_238;
            memcpy(local_238,buf,(long)iVar8);
            u_terminateChars_63(pcVar12,langtagCapacity,iVar24,status);
          }
          else {
LAB_002a12cc:
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            iVar24 = 0;
          }
          bVar29 = false;
        }
      }
      else {
LAB_002a247f:
        bVar29 = true;
        iVar24 = 0;
      }
      uenum_close_63(en);
      if (!bVar29) goto LAB_002a2452;
    }
  }
  _len = (VariantListEntry *)((ulong)_len & 0xffffffff00000000);
  bVar29 = false;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar8 = uloc_getLanguage_63(canonical.buffer.ptr,buf,0xc,&len);
    iVar9 = 3;
    if (len < 1 && len != -0x7c) {
      if (iVar8 == 0) {
LAB_002a135e:
        if (0 < langtagCapacity) {
          pcVar12 = "und";
LAB_002a139a:
          iVar8 = uprv_min_63(iVar9,langtagCapacity);
          memcpy(local_238,pcVar12,(long)iVar8);
        }
      }
      else {
        UVar6 = _isLanguageSubtag(buf,iVar8);
        if (UVar6 == '\0') {
          if (strict != '\0') {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            bVar29 = false;
            iVar9 = 0;
            goto LAB_002a13d8;
          }
          goto LAB_002a135e;
        }
        __s = DEPRECATEDLANGS;
        pcVar12 = buf;
        for (uVar23 = 0; iVar9 = iVar8, uVar23 < 0x9c; uVar23 = uVar23 + 2) {
          sVar11 = strlen(pcVar12);
          sVar13 = strlen(*__s);
          if (sVar11 < sVar13) break;
          iVar27 = strcmp(pcVar12,*__s);
          if (iVar27 == 0) {
            strcpy(buf,__s[1]);
            sVar11 = strlen(buf);
            iVar9 = (int32_t)sVar11;
            break;
          }
          __s = __s + 2;
        }
        if (0 < langtagCapacity) goto LAB_002a139a;
      }
      u_terminateChars_63(local_238,langtagCapacity,iVar9,status);
      bVar29 = *status < U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (strict == '\0') goto LAB_002a135e;
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      bVar29 = false;
      iVar9 = 0;
    }
  }
LAB_002a13d8:
  iVar24 = iVar9 + iVar24;
  _len = (VariantListEntry *)((ulong)_len & 0xffffffff00000000);
  local_250 = (char *)((ulong)local_250._4_4_ << 0x20);
  iVar27 = 0;
  if (bVar29) {
    iVar9 = uloc_getScript_63(canonical.buffer.ptr,buf,6,&len);
    if (len < 1 && len != -0x7c) {
      pcVar12 = local_238 + iVar24;
      iVar26 = langtagCapacity - iVar24;
      if (iVar9 < 1) {
        iVar27 = 0;
      }
      else {
        UVar6 = _isScriptSubtag(buf,iVar9);
        if (UVar6 == '\0') {
          if (strict != '\0') goto LAB_002a1443;
          goto LAB_002a144e;
        }
        if ((0 < iVar26) && (*pcVar12 = '-', iVar26 != 1)) {
          iVar8 = uprv_min_63(iVar9,iVar26 + -1);
          memcpy(pcVar12 + 1,buf,(long)iVar8);
        }
        iVar27 = iVar9 + 1;
      }
      u_terminateChars_63(pcVar12,iVar26,iVar27,status);
    }
    else {
      iVar27 = 0;
      if (strict != '\0') {
LAB_002a1443:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002a144e:
        iVar27 = 0;
      }
    }
  }
  _len = (VariantListEntry *)((ulong)_len & 0xffffffff00000000);
  iVar27 = iVar27 + iVar24;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar9 = uloc_getCountry_63(canonical.buffer.ptr,buf,4,&len);
    if (len < 1 && len != -0x7c) {
      pcVar12 = local_238 + iVar27;
      iVar24 = langtagCapacity - iVar27;
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      else {
        UVar6 = _isRegionSubtag(buf,iVar9);
        if (UVar6 == '\0') {
          if (strict != '\0') goto LAB_002a15b8;
          local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
          goto LAB_002a14f2;
        }
        if (0 < iVar24) {
          *pcVar12 = '-';
        }
        __s2 = DEPRECATEDREGIONS;
        local_250 = pcVar12;
        for (uVar23 = 0; uVar23 < 0xc; uVar23 = uVar23 + 2) {
          iVar26 = strcmp(buf,*__s2);
          if (iVar26 == 0) {
            strcpy(buf,__s2[1]);
            sVar11 = strlen(buf);
            iVar9 = (int32_t)sVar11;
            break;
          }
          __s2 = __s2 + 2;
        }
        pcVar12 = local_250;
        if (1 < iVar24) {
          iVar8 = uprv_min_63(iVar9,iVar24 + -1);
          memcpy(pcVar12 + 1,buf,(long)iVar8);
        }
        iVar9 = iVar9 + 1;
      }
      local_250 = (char *)CONCAT44(local_250._4_4_,iVar9);
      u_terminateChars_63(pcVar12,iVar24,iVar9,status);
    }
    else if (strict != '\0') {
LAB_002a15b8:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
LAB_002a14f2:
  iVar27 = (int)local_250 + iVar27;
  tmpStatus_1 = U_ZERO_ERROR;
  local_230 = 0;
  iVar24 = 0;
  local_250._0_4_ = iVar27;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar12 = buf;
    iVar9 = uloc_getVariant_63(canonical.buffer.ptr,pcVar12,0x9d,&tmpStatus_1);
    if (tmpStatus_1 < U_ILLEGAL_ARGUMENT_ERROR && tmpStatus_1 != U_STRING_NOT_TERMINATED_WARNING) {
      local_240 = local_238 + (int)local_250;
      iVar27 = langtagCapacity - (int)local_250;
      if (iVar9 < 1) {
        local_230 = 0;
        iVar26 = 0;
      }
      else {
        _len = (VariantListEntry *)0x0;
        cVar4 = '\x01';
        local_230 = 0;
        local_220 = (UEnumeration *)(CONCAT44(local_220._4_4_,iVar9) ^ 5);
        pcVar14 = (char *)0x0;
        while (cVar4 != '\0') {
          cVar4 = *pcVar12;
          if (cVar4 == '\0') {
LAB_002a16b0:
            pcVar15 = pcVar14;
            if (pcVar14 == (char *)0x0) {
LAB_002a1724:
              if (strict != '\0') {
LAB_002a189a:
                UVar2 = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002a18fe:
                *status = UVar2;
                iVar26 = 0;
                pVVar16 = _len;
                goto LAB_002a1911;
              }
            }
            else {
              for (; *pcVar15 != '\0'; pcVar15 = pcVar15 + 1) {
                cVar5 = uprv_asciitolower_63(*pcVar15);
                *pcVar15 = cVar5;
              }
              UVar6 = _isVariantSubtag(pcVar14,-1);
              if (UVar6 == '\0') {
                if (strict != '\0') goto LAB_002a189a;
                UVar6 = _isPrivateuseValueSubtag(pcVar14,-1);
                if (UVar6 != '\0') break;
              }
              else {
                iVar24 = strcmp(pcVar14,"posix");
                if (iVar24 == 0 && (int)local_220 == 0) {
                  local_230 = 1;
                }
                else {
                  pVVar16 = (VariantListEntry *)uprv_malloc_63(0x10);
                  if (pVVar16 == (VariantListEntry *)0x0) {
                    UVar2 = U_MEMORY_ALLOCATION_ERROR;
                    goto LAB_002a18fe;
                  }
                  pVVar16->variant = pcVar14;
                  UVar6 = _addVariantToList((VariantListEntry **)&len,pVVar16);
                  if (UVar6 == '\0') {
                    uprv_free_63(pVVar16);
                    goto LAB_002a1724;
                  }
                }
              }
            }
            pcVar14 = (char *)0x0;
          }
          else {
            if ((cVar4 == '_') || (cVar4 == '-')) {
              *pcVar12 = '\0';
              cVar4 = '\x01';
              goto LAB_002a16b0;
            }
            if (pcVar14 == (char *)0x0) {
              pcVar14 = pcVar12;
            }
            cVar4 = '\x01';
          }
          pcVar12 = pcVar12 + 1;
        }
        pVVar16 = _len;
        iVar26 = 0;
        if (_len != (VariantListEntry *)0x0 && *status < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar26 = 0;
          for (pVVar22 = _len; pVVar22 != (VariantListEntry *)0x0; pVVar22 = pVVar22->next) {
            if (iVar26 < iVar27) {
              local_240[iVar26] = '-';
            }
            iVar26 = iVar26 + 1;
            pcVar12 = pVVar22->variant;
            sVar11 = strlen(pcVar12);
            if (iVar27 - iVar26 != 0 && iVar26 <= iVar27) {
              iVar9 = uprv_min_63((int)sVar11,iVar27 - iVar26);
              memcpy(local_240 + iVar26,pcVar12,(long)iVar9);
            }
            iVar26 = iVar26 + (int)sVar11;
          }
        }
LAB_002a1911:
        while (pVVar16 != (VariantListEntry *)0x0) {
          pVVar22 = pVVar16->next;
          uprv_free_63(pVVar16);
          pVVar16 = pVVar22;
        }
        iVar24 = 0;
        if (U_ZERO_ERROR < *status) goto LAB_002a194b;
      }
      iVar24 = iVar26;
      u_terminateChars_63(local_240,iVar27,iVar24,status);
    }
    else {
      if (strict != '\0') {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      local_230 = 0;
      iVar24 = 0;
    }
  }
LAB_002a194b:
  pcVar12 = canonical.buffer.ptr;
  buf[0x50] = '\0';
  buf[0x51] = '\0';
  buf[0x52] = '\0';
  buf[0x53] = '\0';
  buf[0x54] = '\0';
  buf[0x55] = '\0';
  buf[0x56] = '\0';
  buf[0x57] = '\0';
  buf[0x58] = '\0';
  buf[0x59] = '\0';
  buf[0x5a] = '\0';
  buf[0x5b] = '\0';
  buf[0x5c] = '\0';
  buf[0x5d] = '\0';
  buf[0x5e] = '\0';
  buf[0x5f] = '\0';
  buf[0x40] = '\0';
  buf[0x41] = '\0';
  buf[0x42] = '\0';
  buf[0x43] = '\0';
  buf[0x44] = '\0';
  buf[0x45] = '\0';
  buf[0x46] = '\0';
  buf[0x47] = '\0';
  buf[0x48] = '\0';
  buf[0x49] = '\0';
  buf[0x4a] = '\0';
  buf[0x4b] = '\0';
  buf[0x4c] = '\0';
  buf[0x4d] = '\0';
  buf[0x4e] = '\0';
  buf[0x4f] = '\0';
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x3a] = '\0';
  buf[0x3b] = '\0';
  buf[0x3c] = '\0';
  buf[0x3d] = '\0';
  buf[0x3e] = '\0';
  buf[0x3f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x60] = '\0';
  buf[0x61] = '\0';
  buf[0x62] = '\0';
  buf[99] = '\0';
  local_220 = uloc_openKeywords_63(canonical.buffer.ptr,status);
  local_1fc = iVar24 + (int)local_250;
  if (((char)local_230 != '\0') || (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_240 = local_238 + local_1fc;
    local_250._0_4_ = langtagCapacity - local_1fc;
    iVar24 = 0;
    if ((char)local_230 != '\0' || local_220 != (UEnumeration *)0x0) {
      firstExt = (ExtensionListEntry *)0x0;
      firstAttr = (AttributeListEntry *)0x0;
      tmpStatus_1 = U_ZERO_ERROR;
      icu_63::UVector::UVector
                (&local_1e8,anon_unknown.dwarf_2ad6a0::CharStringPool::deleter,
                 (UElementsAreEqual *)0x0,&tmpStatus_1);
      tmpStatus_2 = U_ZERO_ERROR;
      pVVar16 = (VariantListEntry *)0x0;
      local_258 = (char *)0x0;
LAB_002a1a48:
      icu_63::MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)&len);
      local_180 = 0;
      *(char *)&_len->variant = '\0';
      pcVar14 = uenum_next_63(local_220,(int32_t *)0x0,status);
      if (pcVar14 != (char *)0x0) {
        resultCapacity_1 = 100;
        while (pcVar15 = icu_63::CharString::getAppendBuffer
                                   ((CharString *)&len,resultCapacity_1,resultCapacity_1,
                                    &resultCapacity_1,&tmpStatus_2),
              tmpStatus_2 < U_ILLEGAL_ARGUMENT_ERROR) {
          uVar7 = uloc_getKeywordValue_63(pcVar12,pcVar14,pcVar15,resultCapacity_1,&tmpStatus_2);
          if (tmpStatus_2 != U_BUFFER_OVERFLOW_ERROR) {
            if (tmpStatus_2 < U_ILLEGAL_ARGUMENT_ERROR) {
              icu_63::CharString::append((CharString *)&len,pcVar15,uVar7,&tmpStatus_2);
              if (tmpStatus_2 == U_STRING_NOT_TERMINATED_WARNING) {
                tmpStatus_2 = U_ZERO_ERROR;
              }
              sVar11 = strlen(pcVar14);
              iVar24 = strcmp(pcVar14,"attribute");
              if (iVar24 == 0) {
                if ((int)uVar7 < 1) goto LAB_002a1dd5;
                local_258 = (char *)0x0;
                goto LAB_002a1c65;
              }
              if ((int32_t)sVar11 < 2) {
                local_218 = pVVar16;
                if (*pcVar14 == 'x') {
                  cVar4 = _isPrivateuseValueSubtags((char *)_len,uVar7);
                  goto LAB_002a1d67;
                }
                UVar6 = _isExtensionSingleton(pcVar14,(int32_t)sVar11);
                if (UVar6 == '\0') goto LAB_002a1ef2;
                local_1f8 = _len;
                uVar10 = uVar7;
                if ((int)uVar7 < 0) {
                  sVar11 = strlen((char *)_len);
                  uVar10 = (uint)sVar11;
                }
                lVar21 = 0;
                pcVar15 = (char *)0x0;
                pVVar16 = local_1f8;
                goto LAB_002a1e66;
              }
              local_258 = uloc_toUnicodeLocaleKey_63(pcVar14);
              if (local_258 == (char *)0x0) {
                if (strict != '\0') {
                  *status = U_ILLEGAL_ARGUMENT_ERROR;
                  bVar29 = true;
                  local_258 = (char *)0x0;
                  goto LAB_002a1b10;
                }
                local_258 = (char *)0x0;
                goto LAB_002a1c49;
              }
              pVVar16 = (VariantListEntry *)uloc_toUnicodeLocaleType_63(pcVar14,(char *)_len);
              if (pVVar16 == (VariantListEntry *)0x0) {
                if (strict != '\0') {
                  *status = U_ILLEGAL_ARGUMENT_ERROR;
                  bVar29 = true;
                  pVVar16 = (VariantListEntry *)0x0;
                  goto LAB_002a1b10;
                }
                pVVar16 = (VariantListEntry *)0x0;
                goto LAB_002a1c49;
              }
              if (pVVar16 != _len) goto LAB_002a1dd5;
              pCVar17 = anon_unknown.dwarf_2ad6a0::CharStringPool::create
                                  ((CharStringPool *)&tmpStatus_1);
              if (pCVar17 == (CharString *)0x0) goto LAB_002a1aeb;
              sVar11 = strlen((char *)pVVar16);
              iVar9 = (int32_t)sVar11;
              pcVar14 = icu_63::CharString::getAppendBuffer
                                  (pCVar17,iVar9,iVar9,&local_1bc,&tmpStatus_2);
              if (tmpStatus_2 < U_ILLEGAL_ARGUMENT_ERROR) {
                strcpy(pcVar14,(char *)pVVar16);
                T_CString_toLowerCase_63(pcVar14);
                icu_63::CharString::append(pCVar17,pcVar14,iVar9,&tmpStatus_2);
                if (tmpStatus_2 < U_ILLEGAL_ARGUMENT_ERROR) {
                  pVVar16 = (VariantListEntry *)(pCVar17->buffer).ptr;
                  goto LAB_002a1dd5;
                }
              }
              *status = tmpStatus_2;
              goto LAB_002a1b0e;
            }
            break;
          }
          tmpStatus_2 = U_ZERO_ERROR;
          resultCapacity_1 = uVar7;
        }
        if (tmpStatus_2 != U_MEMORY_ALLOCATION_ERROR) {
          if (strict == '\0') {
            tmpStatus_2 = U_ZERO_ERROR;
            goto LAB_002a1c49;
          }
          goto LAB_002a1b03;
        }
        goto LAB_002a1aeb;
      }
      goto LAB_002a1b0e;
    }
    goto LAB_002a21c1;
  }
  uenum_close_63(local_220);
LAB_002a21bc:
  iVar9 = 0;
  goto LAB_002a21d9;
  while( true ) {
    uprv_free_63(pAVar18);
    uprv_free_63(pcVar14);
    if (strict != '\0') break;
LAB_002a1c65:
    do {
      for (uVar23 = 0; iVar24 = (int)uVar23,
          (long)((long)(int)local_258 + uVar23) < (long)(ulong)uVar7; uVar23 = uVar23 + 1) {
        cVar4 = *(char *)((long)&_len->variant + uVar23 + (long)(int)local_258);
        if (cVar4 == '-') {
          uVar10 = (int)local_258 + iVar24 + 1;
          goto LAB_002a1ca6;
        }
        buf[uVar23] = cVar4;
      }
      uVar10 = (int)local_258 + iVar24;
LAB_002a1ca6:
      local_258 = (char *)(ulong)uVar10;
      if ((uVar23 & 0xffffffff) == 0) {
        if ((int)uVar7 <= (int)uVar10) goto LAB_002a1dc6;
      }
      else {
        buf[uVar23 & 0xffffffff] = '\0';
      }
      pAVar18 = (AttributeListEntry *)uprv_malloc_63(0x10);
      if ((pAVar18 == (AttributeListEntry *)0x0) ||
         (pcVar14 = (char *)uprv_malloc_63((ulong)(iVar24 + 1)), pcVar14 == (char *)0x0)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        goto LAB_002a1dc6;
      }
      strcpy(pcVar14,buf);
      pAVar18->attribute = pcVar14;
      UVar6 = _addAttributeToList(&firstAttr,pAVar18);
    } while (UVar6 != '\0');
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002a1dc6:
  pVVar16 = (VariantListEntry *)0x0;
  local_258 = "attribute";
LAB_002a1dd5:
  pEVar19 = (ExtensionListEntry *)uprv_malloc_63(0x18);
  if (pEVar19 == (ExtensionListEntry *)0x0) {
LAB_002a1aeb:
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    pEVar19->key = local_258;
    pEVar19->value = (char *)pVVar16;
    UVar6 = _addExtensionToList(&firstExt,pEVar19,'\x01');
    if ((UVar6 != '\0') || (uprv_free_63(pEVar19), strict == '\0')) {
LAB_002a1c49:
      bVar29 = false;
      goto LAB_002a1b10;
    }
LAB_002a1b03:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
LAB_002a1b0e:
  bVar29 = true;
LAB_002a1b10:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray((MaybeStackArray<char,_40> *)&len);
  if (bVar29) goto LAB_002a1f56;
  goto LAB_002a1a48;
LAB_002a1e66:
  if ((int)uVar10 <= lVar21) goto LAB_002a1edd;
  pcVar1 = (char *)((long)&pVVar16->variant + lVar21);
  if (*pcVar1 == '-') {
    if ((pcVar15 == (char *)0x0) ||
       (UVar6 = _isExtensionSubtag(pcVar15,((int)pVVar16 + (int)lVar21) - (int)pcVar15),
       UVar6 == '\0')) goto LAB_002a1ef2;
    pVVar16 = local_1f8;
    pcVar15 = (char *)0x0;
  }
  else if (pcVar15 == (char *)0x0) {
    pcVar15 = pcVar1;
  }
  lVar21 = lVar21 + 1;
  goto LAB_002a1e66;
LAB_002a1edd:
  if (pcVar15 != (char *)0x0) {
    cVar4 = _isExtensionSubtag(pcVar15,(int)lVar21 + ((int)pVVar16 - (int)pcVar15));
LAB_002a1d67:
    if (cVar4 != '\0') {
      pCVar17 = anon_unknown.dwarf_2ad6a0::CharStringPool::create((CharStringPool *)&tmpStatus_1);
      pVVar16 = local_218;
      if (pCVar17 == (CharString *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        icu_63::CharString::append(pCVar17,(char *)_len,uVar7,&tmpStatus_2);
        if (tmpStatus_2 < U_ILLEGAL_ARGUMENT_ERROR) {
          pVVar16 = (VariantListEntry *)(pCVar17->buffer).ptr;
          local_258 = pcVar14;
          goto LAB_002a1dd5;
        }
        *status = tmpStatus_2;
      }
      bVar29 = true;
      local_258 = pcVar14;
      goto LAB_002a1b10;
    }
  }
LAB_002a1ef2:
  bVar29 = strict != '\0';
  pVVar16 = local_218;
  if (bVar29) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  goto LAB_002a1b10;
LAB_002a1f56:
  if ((char)local_230 == '\0') {
LAB_002a1fa2:
    pEVar19 = firstExt;
    iVar24 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pvVar20 = (void *)((ulong)firstAttr | (ulong)firstExt);
      if (pvVar20 == (void *)0x0) {
        iVar24 = 0;
        pEVar19 = (ExtensionListEntry *)0x0;
      }
      else {
        iVar24 = 0;
        local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
        for (pEVar25 = firstExt; pEVar25 != (ExtensionListEntry *)0x0; pEVar25 = pEVar25->next) {
          pcVar12 = pEVar25->key;
          bVar29 = (char)local_258 == '\0';
          local_258 = (char *)CONCAT44(local_258._4_4_,(int)CONCAT71((int7)((ulong)pvVar20 >> 8),1))
          ;
          if (bVar29) {
            sVar11 = strlen(pcVar12);
            if (sVar11 < 2) {
              local_258 = (char *)((ulong)local_258 & 0xffffffff00000000);
            }
            else {
              if (iVar24 < (int)local_250) {
                local_240[iVar24] = '-';
              }
              lVar21 = (long)iVar24 + 1;
              if ((int)lVar21 < (int)local_250) {
                local_240[lVar21] = 'u';
              }
              iVar24 = iVar24 + 2;
              pcVar12 = pEVar25->key;
            }
          }
          uVar7 = strcmp(pcVar12,"attribute");
          pvVar20 = (void *)(ulong)uVar7;
          if (uVar7 == 0) {
            ppAVar28 = &firstAttr;
            while (pAVar18 = *ppAVar28, pAVar18 != (AttributeListEntry *)0x0) {
              if (iVar24 < (int)local_250) {
                local_240[iVar24] = '-';
              }
              iVar24 = iVar24 + 1;
              pcVar12 = pAVar18->attribute;
              pvVar20 = (void *)strlen(pcVar12);
              iVar27 = (int)pvVar20;
              if ((int)local_250 - iVar24 != 0 && iVar24 <= (int)local_250) {
                iVar9 = uprv_min_63(iVar27,(int)local_250 - iVar24);
                pvVar20 = memcpy(local_240 + iVar24,pcVar12,(long)iVar9);
              }
              iVar24 = iVar24 + iVar27;
              ppAVar28 = &pAVar18->next;
            }
          }
          else {
            if (iVar24 < (int)local_250) {
              local_240[iVar24] = '-';
              pcVar12 = pEVar25->key;
            }
            iVar24 = iVar24 + 1;
            sVar11 = strlen(pcVar12);
            if ((int)local_250 - iVar24 != 0 && iVar24 <= (int)local_250) {
              iVar9 = uprv_min_63((int)sVar11,(int)local_250 - iVar24);
              memcpy(local_240 + iVar24,pcVar12,(long)iVar9);
            }
            iVar24 = iVar24 + (int)sVar11;
            if (iVar24 < (int)local_250) {
              local_240[iVar24] = '-';
            }
            iVar24 = iVar24 + 1;
            pcVar12 = pEVar25->value;
            pvVar20 = (void *)strlen(pcVar12);
            iVar27 = (int)pvVar20;
            if ((int)local_250 - iVar24 != 0 && iVar24 <= (int)local_250) {
              iVar9 = uprv_min_63(iVar27,(int)local_250 - iVar24);
              pvVar20 = memcpy(local_240 + iVar24,pcVar12,(long)iVar9);
            }
            iVar24 = iVar24 + iVar27;
          }
        }
      }
    }
  }
  else {
    pEVar19 = (ExtensionListEntry *)uprv_malloc_63(0x18);
    if (pEVar19 != (ExtensionListEntry *)0x0) {
      pEVar19->key = "va";
      pEVar19->value = "posix";
      UVar6 = _addExtensionToList(&firstExt,pEVar19,'\x01');
      if (UVar6 == '\0') {
        uprv_free_63(pEVar19);
      }
      goto LAB_002a1fa2;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
    iVar24 = 0;
    pEVar19 = firstExt;
  }
  while (pAVar18 = firstAttr, pEVar19 != (ExtensionListEntry *)0x0) {
    pEVar25 = pEVar19->next;
    uprv_free_63(pEVar19);
    pEVar19 = pEVar25;
  }
  while (pAVar18 != (AttributeListEntry *)0x0) {
    pAVar3 = pAVar18->next;
    uprv_free_63(pAVar18->attribute);
    uprv_free_63(pAVar18);
    pAVar18 = pAVar3;
  }
  uenum_close_63(local_220);
  UVar2 = *status;
  icu_63::UVector::~UVector(&local_1e8);
  if (U_ZERO_ERROR < UVar2) goto LAB_002a21bc;
LAB_002a21c1:
  iVar9 = u_terminateChars_63(local_240,(int)local_250,iVar24,status);
LAB_002a21d9:
  iVar24 = iVar9 + local_1fc;
  tmpStatus_1 = U_ZERO_ERROR;
  local_250 = (char *)((ulong)local_250._4_4_ << 0x20);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar12 = buf;
    iVar9 = uloc_getVariant_63(canonical.buffer.ptr,pcVar12,0x9d,&tmpStatus_1);
    if (tmpStatus_1 < U_ILLEGAL_ARGUMENT_ERROR && tmpStatus_1 != U_STRING_NOT_TERMINATED_WARNING) {
      iVar27 = langtagCapacity - iVar24;
      if (iVar9 < 1) {
        bVar29 = *status < U_ILLEGAL_ARGUMENT_ERROR;
        iVar26 = 0;
      }
      else {
        local_240 = (char *)CONCAT44(local_240._4_4_,iVar24);
        cVar4 = '\x01';
        iVar26 = 0;
        pcVar14 = (char *)0x0;
        bVar29 = true;
        while (cVar4 != '\0') {
          cVar4 = *pcVar12;
          if (cVar4 == '\0') {
LAB_002a229e:
            pcVar15 = pcVar14;
            if (pcVar14 != (char *)0x0) {
              for (; *pcVar15 != '\0'; pcVar15 = pcVar15 + 1) {
                cVar5 = uprv_asciitolower_63(*pcVar15);
                *pcVar15 = cVar5;
              }
              UVar6 = _isPrivateuseValueSubtag(pcVar14,-1);
              if (UVar6 == '\0') {
                if (strict != '\0') goto LAB_002a2243;
                break;
              }
              if ((!bVar29) || (UVar6 = _isVariantSubtag(pcVar14,-1), UVar6 == '\0')) {
                if (iVar26 < iVar27) {
                  lVar21 = (long)iVar26;
                  iVar26 = iVar26 + 1;
                  *(undefined1 *)((long)&len + lVar21) = 0x2d;
                }
                iVar24 = iVar26;
                if (bVar29) {
                  if (iVar26 < iVar27) {
                    lVar21 = (long)iVar26;
                    iVar26 = iVar26 + 1;
                    *(undefined1 *)((long)&len + lVar21) = 0x78;
                  }
                  if (iVar26 < iVar27) {
                    lVar21 = (long)iVar26;
                    iVar26 = iVar26 + 1;
                    *(undefined1 *)((long)&len + lVar21) = 0x2d;
                  }
                  if (iVar27 - iVar26 != 0 && iVar26 <= iVar27) {
                    iVar9 = uprv_min_63(8,iVar27 - iVar26);
                    memcpy((void *)((long)&len + (long)iVar26),"lvariant",(long)iVar9);
                  }
                  iVar24 = iVar26 + 8;
                  if (iVar26 + 8 < iVar27) {
                    iVar24 = iVar26 + 9;
                    auStack_1b0[iVar26] = 0x2d;
                  }
                }
                sVar11 = strlen(pcVar14);
                if (iVar27 - iVar24 != 0 && iVar24 <= iVar27) {
                  iVar9 = uprv_min_63((int)sVar11,iVar27 - iVar24);
                  memcpy((void *)((long)&len + (long)iVar24),pcVar14,(long)iVar9);
                }
                iVar26 = iVar24 + (int)sVar11;
                pcVar14 = (char *)0x0;
                bVar29 = false;
                goto LAB_002a23c2;
              }
            }
            pcVar14 = (char *)0x0;
          }
          else {
            if ((cVar4 == '_') || (cVar4 == '-')) {
              *pcVar12 = '\0';
              cVar4 = '\x01';
              goto LAB_002a229e;
            }
            if (pcVar14 == (char *)0x0) {
              pcVar14 = pcVar12;
            }
            cVar4 = '\x01';
          }
LAB_002a23c2:
          pcVar12 = pcVar12 + 1;
        }
        local_250 = (char *)((ulong)local_250 & 0xffffffff00000000);
        iVar24 = (int)local_240;
        if (U_ZERO_ERROR < *status) goto LAB_002a244a;
        bVar29 = true;
      }
      pcVar12 = local_238 + iVar24;
      if ((bVar29) && (iVar27 - iVar26 != 0 && iVar26 <= iVar27)) {
        iVar9 = uprv_min_63(iVar26,iVar27 - iVar26);
        memcpy(pcVar12,&len,(long)iVar9);
      }
      local_250 = (char *)CONCAT44(local_250._4_4_,iVar26);
      u_terminateChars_63(pcVar12,iVar27,iVar26,status);
    }
    else {
      local_240 = (char *)CONCAT44(local_240._4_4_,iVar24);
      if (strict != '\0') {
LAB_002a2243:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      iVar24 = (int)local_240;
    }
  }
LAB_002a244a:
  iVar24 = (int)local_250 + iVar24;
LAB_002a2452:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&canonical.buffer);
  return iVar24;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_toLanguageTag(const char* localeID,
                   char* langtag,
                   int32_t langtagCapacity,
                   UBool strict,
                   UErrorCode* status) {
    icu::CharString canonical;
    int32_t reslen;
    UErrorCode tmpStatus = U_ZERO_ERROR;
    UBool hadPosix = FALSE;
    const char* pKeywordStart;

    /* Note: uloc_canonicalize returns "en_US_POSIX" for input locale ID "".  See #6835 */
    int32_t resultCapacity = static_cast<int32_t>(uprv_strlen(localeID));
    if (resultCapacity > 0) {
        char* buffer;

        for (;;) {
            buffer = canonical.getAppendBuffer(
                    /*minCapacity=*/resultCapacity,
                    /*desiredCapacityHint=*/resultCapacity,
                    resultCapacity,
                    tmpStatus);

            if (U_FAILURE(tmpStatus)) {
                *status = tmpStatus;
                return 0;
            }

            reslen =
                uloc_canonicalize(localeID, buffer, resultCapacity, &tmpStatus);

            if (tmpStatus != U_BUFFER_OVERFLOW_ERROR) {
                break;
            }

            resultCapacity = reslen;
            tmpStatus = U_ZERO_ERROR;
        }

        if (U_FAILURE(tmpStatus)) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }

        canonical.append(buffer, reslen, tmpStatus);
        if (tmpStatus == U_STRING_NOT_TERMINATED_WARNING) {
            tmpStatus = U_ZERO_ERROR;  // Terminators provided by CharString.
        }

        if (U_FAILURE(tmpStatus)) {
            *status = tmpStatus;
            return 0;
        }
    }

    reslen = 0;

    /* For handling special case - private use only tag */
    pKeywordStart = locale_getKeywordsStart(canonical.data());
    if (pKeywordStart == canonical.data()) {
        UEnumeration *kwdEnum;
        int kwdCnt = 0;
        UBool done = FALSE;

        kwdEnum = uloc_openKeywords(canonical.data(), &tmpStatus);
        if (kwdEnum != NULL) {
            kwdCnt = uenum_count(kwdEnum, &tmpStatus);
            if (kwdCnt == 1) {
                const char *key;
                int32_t len = 0;

                key = uenum_next(kwdEnum, &len, &tmpStatus);
                if (len == 1 && *key == PRIVATEUSE) {
                    char buf[ULOC_KEYWORD_AND_VALUES_CAPACITY];
                    buf[0] = PRIVATEUSE;
                    buf[1] = SEP;
                    len = uloc_getKeywordValue(localeID, key, &buf[2], sizeof(buf) - 2, &tmpStatus);
                    if (U_SUCCESS(tmpStatus)) {
                        if (_isPrivateuseValueSubtags(&buf[2], len)) {
                            /* return private use only tag */
                            reslen = len + 2;
                            uprv_memcpy(langtag, buf, uprv_min(reslen, langtagCapacity));
                            u_terminateChars(langtag, langtagCapacity, reslen, status);
                            done = TRUE;
                        } else if (strict) {
                            *status = U_ILLEGAL_ARGUMENT_ERROR;
                            done = TRUE;
                        }
                        /* if not strict mode, then "und" will be returned */
                    } else {
                        *status = U_ILLEGAL_ARGUMENT_ERROR;
                        done = TRUE;
                    }
                }
            }
            uenum_close(kwdEnum);
            if (done) {
                return reslen;
            }
        }
    }

    reslen += _appendLanguageToLanguageTag(canonical.data(), langtag, langtagCapacity, strict, status);
    reslen += _appendScriptToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, status);
    reslen += _appendRegionToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, status);
    reslen += _appendVariantsToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, &hadPosix, status);
    reslen += _appendKeywordsToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, hadPosix, status);
    reslen += _appendPrivateuseToLanguageTag(canonical.data(), langtag + reslen, langtagCapacity - reslen, strict, hadPosix, status);

    return reslen;
}